

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::SPxDevexPR<double>::buildBestPriceVectorEnterDim
          (SPxDevexPR<double> *this,double *best,double feastol)

{
  double viol;
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  char *pcVar4;
  int *piVar5;
  IdxElement *pIVar6;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  int i_1;
  int i;
  IdxElement price;
  double *cpen;
  double *coTest;
  double x;
  int nsorted;
  int idx;
  int in_stack_000000a0;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff74;
  long in_stack_ffffffffffffff80;
  int i_00;
  SPxSolverBase<double> *in_stack_ffffffffffffff88;
  int local_58;
  uint local_54;
  DataKey local_8;
  
  SPxSolverBase<double>::coTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  pdVar2 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e353b);
  pdVar3 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e3558);
  Array<soplex::SPxPricer<double>::IdxElement>::clear
            ((Array<soplex::SPxPricer<double>::IdxElement> *)0x2e356b);
  IdxSet::clear((IdxSet *)(in_RDI + 0x70));
  local_54 = IdxSet::size((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8));
  uVar7 = extraout_RDX;
  while (local_54 = local_54 - 1, -1 < (int)local_54) {
    pcVar4 = IdxSet::index((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8),(char *)(ulong)local_54,
                           (int)uVar7);
    iVar1 = (int)pcVar4;
    viol = pdVar2[iVar1];
    if (-in_XMM0_Qa <= viol) {
      IdxSet::remove((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8),(char *)(ulong)local_54);
      piVar5 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x868),iVar1);
      *piVar5 = 0;
      uVar7 = extraout_RDX_01;
    }
    else {
      piVar5 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x868),iVar1);
      *piVar5 = 1;
      devexpr::computePrice<double>(viol,pdVar3[iVar1],in_XMM0_Qa);
      Array<soplex::SPxPricer<double>::IdxElement>::append
                ((Array<soplex::SPxPricer<double>::IdxElement> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (IdxElement *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      uVar7 = extraout_RDX_00;
    }
  }
  pIVar6 = Array<soplex::SPxPricer<double>::IdxElement>::get_const_ptr
                     ((Array<soplex::SPxPricer<double>::IdxElement> *)0x2e36b5);
  *(IdxElement **)(in_RDI + 0x30) = pIVar6;
  Array<soplex::SPxPricer<double>::IdxElement>::get_ptr
            ((Array<soplex::SPxPricer<double>::IdxElement> *)0x2e36c7);
  Array<soplex::SPxPricer<double>::IdxElement>::size
            ((Array<soplex::SPxPricer<double>::IdxElement> *)0x2e36e6);
  uVar8 = 1;
  iVar1 = SPxQuicksortPart<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
                    ((IdxElement *)this,(IdxCompare *)best,feastol._4_4_,feastol._0_4_,idx,nsorted,
                     in_stack_000000a0,x._7_1_);
  for (local_58 = 0; i_00 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20), local_58 < iVar1;
      local_58 = local_58 + 1) {
    in_stack_ffffffffffffff80 = in_RDI + 0x70;
    Array<soplex::SPxPricer<double>::IdxElement>::operator[]
              ((Array<soplex::SPxPricer<double>::IdxElement> *)
               CONCAT44(in_stack_ffffffffffffff74,uVar8),in_stack_ffffffffffffff6c);
    DIdxSet::addIdx((DIdxSet *)CONCAT44(in_stack_ffffffffffffff74,uVar8),in_stack_ffffffffffffff6c);
    in_stack_ffffffffffffff88 = (SPxSolverBase<double> *)(*(long *)(in_RDI + 0x10) + 0x868);
    pIVar6 = Array<soplex::SPxPricer<double>::IdxElement>::operator[]
                       ((Array<soplex::SPxPricer<double>::IdxElement> *)
                        CONCAT44(in_stack_ffffffffffffff74,uVar8),in_stack_ffffffffffffff6c);
    piVar5 = DataArray<int>::operator[]((DataArray<int> *)in_stack_ffffffffffffff88,pIVar6->idx);
    *piVar5 = 2;
  }
  if (iVar1 < 1) {
    SPxId::SPxId((SPxId *)0x2e37f6);
  }
  else {
    pIVar6 = Array<soplex::SPxPricer<double>::IdxElement>::operator[]
                       ((Array<soplex::SPxPricer<double>::IdxElement> *)
                        CONCAT44(in_stack_ffffffffffffff74,uVar8),in_stack_ffffffffffffff6c);
    *in_RSI = pIVar6->val;
    Array<soplex::SPxPricer<double>::IdxElement>::operator[]
              ((Array<soplex::SPxPricer<double>::IdxElement> *)
               CONCAT44(in_stack_ffffffffffffff74,uVar8),in_stack_ffffffffffffff6c);
    local_8 = (DataKey)SPxSolverBase<double>::coId(in_stack_ffffffffffffff88,i_00);
  }
  return (SPxId)local_8;
}

Assistant:

SPxId SPxDevexPR<R>::buildBestPriceVectorEnterDim(R& best, R feastol)
{
   int idx;
   int nsorted;
   R x;
   const R* coTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   typename SPxPricer<R>::IdxElement price;
   prices.clear();
   bestPrices.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = coTest[idx];

      if(x < -feastol)
      {
         this->thesolver->isInfeasible[idx] = this->VIOLATED;
         price.idx = idx;
         price.val = devexpr::computePrice(x, cpen[idx], feastol);
         prices.append(price);
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < prices.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(prices[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(prices[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = prices.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(prices.get_ptr(), this->compare, 0, prices.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPrices.addIdx(prices[i].idx);
      this->thesolver->isInfeasible[prices[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = prices[0].val;
      return this->thesolver->coId(prices[0].idx);
   }
   else
      return SPxId();
}